

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O2

Map_Node_t * Map_NodeCreate(Map_Man_t *p,Map_Node_t *p1,Map_Node_t *p2)

{
  int *piVar1;
  int iVar2;
  Map_Node_t *Entry;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  Entry = (Map_Node_t *)Extra_MmFixedEntryFetch(p->mmNodes);
  memset(&Entry->pNext,0,0xb0);
  Entry->tRequired[1].Fall = 3.4028235e+37;
  Entry->tRequired[1].Worst = 3.4028235e+37;
  Entry->tRequired[0].Rise = 3.4028235e+37;
  Entry->tRequired[0].Fall = 3.4028235e+37;
  *(undefined8 *)&Entry->tRequired[0].Worst = 0x7dcccccc7dcccccc;
  Entry->p1 = p1;
  Entry->p2 = p2;
  Entry->p = p;
  iVar2 = p->nNodes;
  p->nNodes = iVar2 + 1;
  Entry->Num = iVar2;
  if (iVar2 < 0) {
    Entry->field_0x1c = Entry->field_0x1c | 8;
  }
  else {
    Map_NodeVecPush(p->vMapObjs,Entry);
  }
  if (p1 != (Map_Node_t *)0x0) {
    uVar4 = *(uint *)(((ulong)Entry->p1 & 0xfffffffffffffffe) + 0x1c);
    if (p2 == (Map_Node_t *)0x0) {
      uVar4 = *(uint *)&Entry->field_0x1c & 0xffe0001f | uVar4 & 0x1fffe0;
      *(uint *)&Entry->field_0x1c = uVar4;
      if (((ulong)p1 & 1) == 0) {
        uVar3 = *(uint *)&p1->field_0x1c;
      }
      else {
        uVar3 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0x1c);
      }
      uVar3 = uVar3 & 8;
    }
    else {
      uVar3 = uVar4 >> 5 & 0xffff;
      uVar4 = *(uint *)(((ulong)Entry->p2 & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff;
      if (uVar4 < uVar3) {
        uVar4 = uVar3;
      }
      uVar4 = *(uint *)&Entry->field_0x1c & 0xffe0001f | uVar4 * 0x20 + 0x20 & 0x1fffe0;
      *(uint *)&Entry->field_0x1c = uVar4;
      if (((ulong)p1 & 1) == 0) {
        uVar3 = *(uint *)&p1->field_0x1c;
      }
      else {
        uVar3 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0x1c);
      }
      if (((ulong)p2 & 1) == 0) {
        uVar5 = *(uint *)&p2->field_0x1c;
      }
      else {
        uVar5 = ~*(uint *)(((ulong)p2 & 0xfffffffffffffffe) + 0x1c);
      }
      uVar3 = uVar3 & 8 & uVar5 & 8;
    }
    *(uint *)&Entry->field_0x1c = uVar4 & 0xfffffff7 | uVar3;
    piVar1 = (int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x18);
    *piVar1 = *piVar1 + 1;
  }
  if (p2 != (Map_Node_t *)0x0) {
    piVar1 = (int *)(((ulong)p2 & 0xfffffffffffffffe) + 0x18);
    *piVar1 = *piVar1 + 1;
  }
  Entry->nRefEst[0] = -1.0;
  Entry->nRefEst[1] = -1.0;
  return Entry;
}

Assistant:

Map_Node_t * Map_NodeCreate( Map_Man_t * p, Map_Node_t * p1, Map_Node_t * p2 )
{
    Map_Node_t * pNode;
    // create the node
    pNode = (Map_Node_t *)Extra_MmFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Map_Node_t) );
    pNode->tRequired[0].Rise = pNode->tRequired[0].Fall = pNode->tRequired[0].Worst = MAP_FLOAT_LARGE;
    pNode->tRequired[1].Rise = pNode->tRequired[1].Fall = pNode->tRequired[1].Worst = MAP_FLOAT_LARGE;
    pNode->p1  = p1; 
    pNode->p2  = p2;
    pNode->p = p;
    // set the number of this node
    pNode->Num = p->nNodes++;
    // place to store the fanouts
//    pNode->vFanouts = Map_NodeVecAlloc( 5 );
    // store this node in the internal array
    if ( pNode->Num >= 0 )
        Map_NodeVecPush( p->vMapObjs, pNode );
    else
        pNode->fInv = 1;
    // set the level of this node
    if ( p1 ) 
    {
#ifdef MAP_ALLOCATE_FANOUT
        // create the fanout info
        Map_NodeAddFaninFanout( Map_Regular(p1), pNode );
        if ( p2 )
        Map_NodeAddFaninFanout( Map_Regular(p2), pNode );
#endif

        if ( p2 )
        {
            pNode->Level = 1 + MAP_MAX(Map_Regular(pNode->p1)->Level, Map_Regular(pNode->p2)->Level);
            pNode->fInv  = Map_NodeIsSimComplement(p1) & Map_NodeIsSimComplement(p2);
        }
        else
        {
            pNode->Level = Map_Regular(pNode->p1)->Level;
            pNode->fInv  = Map_NodeIsSimComplement(p1);
        }
    }
    // reference the inputs (will be used to compute the number of fanouts)
    if ( p1 ) Map_NodeRef(p1);
    if ( p2 ) Map_NodeRef(p2);

    pNode->nRefEst[0] = pNode->nRefEst[1] = -1;
    return pNode;
}